

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O2

void __thiscall summarycalc::dofmsummary(summarycalc *this)

{
  size_t sVar1;
  ostream *poVar2;
  char *pcVar3;
  uint samplesize;
  uint streamtype;
  
  std::__cxx11::string::string
            ((string *)&streamtype,"input/fmsummaryxref.bin",(allocator *)&samplesize);
  loadsummaryxref(this,(string *)&streamtype);
  std::__cxx11::string::~string((string *)&streamtype);
  outputstreamtype(this);
  streamtype = 0;
  sVar1 = fread(&streamtype,4,1,_stdin);
  if ((int)sVar1 == 0) {
    poVar2 = (ostream *)&std::cerr;
    pcVar3 = "FATAL: summarycalc: Read error on stream\n";
  }
  else {
    if ((streamtype >> 0x19 & 1) != 0) {
      samplesize = 0;
      sVar1 = fread(&samplesize,4,1,_stdin);
      if ((int)sVar1 == 0) {
        std::operator<<((ostream *)&std::cerr,"FATAL: summarycalc: Read error on stream\n");
      }
      else {
        dosummaryprocessing(this,samplesize);
      }
      return;
    }
    std::operator<<((ostream *)&std::cerr,"FATAL: summarycalc: Not a fm stream\n");
    poVar2 = std::operator<<((ostream *)&std::cerr,"FATAL: summarycalc: invalid stream type: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    pcVar3 = "\n";
  }
  std::operator<<(poVar2,pcVar3);
  exit(-1);
}

Assistant:

void summarycalc::dofmsummary()
{
	loadsummaryxref(FMSUMMARYXREF_FILE);
	outputstreamtype();
	unsigned int streamtype = 0;
	int i = (int) fread(&streamtype, sizeof(streamtype), 1, stdin);
	if (i) {
		if (isFMStream(streamtype) == true) {
			unsigned int samplesize = 0;
			i = (int) fread(&samplesize, sizeof(samplesize), 1, stdin);
			if (i)	dosummaryprocessing(samplesize);
			else std::cerr << "FATAL: summarycalc: Read error on stream\n";
			return;
		}
		else {
			std::cerr << "FATAL: summarycalc: Not a fm stream\n";
			std::cerr << "FATAL: summarycalc: invalid stream type: " << streamtype << "\n";
		}
	}
	else {
		std::cerr << "FATAL: summarycalc: Read error on stream\n";
	}
	::exit(-1);

}